

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece_processor.cc
# Opt level: O3

Status __thiscall
sentencepiece::SentencePieceProcessor::CalculateEntropy
          (SentencePieceProcessor *this,string_view input,float alpha,float *entropy)

{
  char cVar1;
  Status *_status;
  size_t sVar2;
  undefined4 *in_R8;
  undefined4 uVar3;
  vector<unsigned_long,_std::allocator<unsigned_long>_> norm_to_orig;
  string normalized;
  undefined1 *local_1b0;
  undefined8 local_1a8;
  undefined1 local_1a0;
  undefined7 uStack_19f;
  ios_base local_138 [264];
  
  sVar2 = input._M_len;
  cVar1 = (**(code **)(**(long **)(sVar2 + 8) + 0x68))();
  if (cVar1 == '\0') {
    local_1b0 = (undefined1 *)CONCAT44(local_1b0._4_4_,0xd);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"src/sentencepiece_processor.cc",0x1e);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"(",1);
    std::ostream::operator<<((ostream *)&local_1a8,0x2ef);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,") [",3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"model_->IsCalculateEntropyAvailable()",0x25);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"] ",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"CalculateEntropy is not available for the current model.",0x38
              );
    util::StatusBuilder::operator_cast_to_Status((StatusBuilder *)this);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
    std::ios_base::~ios_base(local_138);
  }
  else {
    local_1a8 = 0;
    local_1a0 = 0;
    local_1b0 = &local_1a0;
    (**(code **)(**(long **)(sVar2 + 0x10) + 0x20))
              (this,*(long **)(sVar2 + 0x10),input._M_str,entropy,&local_1b0);
    if (this->_vptr_SentencePieceProcessor == (_func_int **)0x0) {
      util::Status::~Status((Status *)this);
      uVar3 = (**(code **)(**(long **)(sVar2 + 8) + 0x48))
                        (alpha,*(long **)(sVar2 + 8),local_1a8,local_1b0);
      *in_R8 = uVar3;
      util::Status::Status((Status *)this);
    }
    if (local_1b0 != &local_1a0) {
      operator_delete(local_1b0,CONCAT71(uStack_19f,local_1a0) + 1);
    }
  }
  return (unique_ptr<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
          )(unique_ptr<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
            )this;
}

Assistant:

util::Status SentencePieceProcessor::CalculateEntropy(absl::string_view input,
                                                      float alpha,
                                                      float *entropy) const {
  CHECK_OR_RETURN(model_->IsCalculateEntropyAvailable())
      << "CalculateEntropy is not available for the current model.";
  std::string normalized;
  std::vector<size_t> norm_to_orig;
  RETURN_IF_ERROR(normalizer_->Normalize(input, &normalized, &norm_to_orig));

  *entropy = model_->CalculateEntropy(normalized, alpha);
  return util::OkStatus();
}